

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSendSession.cpp
# Opt level: O0

SessionFactory *
FileSendSession::create_session_factory(SessionFactory *__return_storage_ptr__,path *path)

{
  path local_38;
  path *local_18;
  path *path_local;
  
  local_18 = path;
  path_local = (path *)__return_storage_ptr__;
  boost::filesystem::path::path(&local_38,path);
  std::function<std::shared_ptr<Subscriber>(Poll&,TCPServer&,sockaddr_in)>::
  function<FileSendSession::create_session_factory(boost::filesystem::path_const&)::__0,void>
            ((function<std::shared_ptr<Subscriber>(Poll&,TCPServer&,sockaddr_in)> *)
             __return_storage_ptr__,(anon_class_32_1_89901123 *)&local_38);
  create_session_factory(boost::filesystem::path_const&)::$_0::~__0((__0 *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

TCPServer::SessionFactory FileSendSession::create_session_factory(const fs::path &path) {
  return [=](Poll &p, TCPServer &server, sockaddr_in client) -> std::shared_ptr<Subscriber> {
    p.unsubscribe(server);
    auto s = std::make_shared<FileSendSession>(path);
    s->when_success([](auto a) { std::cout << "Sent file " << a << std::endl; });
    s->when_error([](auto a) { std::cout << "Could not send file " << a << std::endl; });
    return s;
  };
}